

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O2

void __thiscall ValidateVulnerability::CheckVulnerabilityID(ValidateVulnerability *this)

{
  Validate *this_00;
  uint uVar1;
  uint uVar2;
  
  this_00 = &this->super_Validate;
  uVar2 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,this->vulIDName_,this->initialVulID_);
  (this->v_).vulnerability_id = uVar2;
  if (this->prevVulID_ <= (int)uVar2) {
    return;
  }
  uVar1 = (this->super_Validate).lineno_;
  fprintf(_stderr,
          "ERROR: Vulnerability IDs %d and %d in lines %d and %d respectively are not in ascending order:\n%s\n%s\n"
          ,(ulong)(uint)this->prevVulID_,(ulong)uVar2,(ulong)(uVar1 - 1),(ulong)uVar1,this_00,
          this->prevLine_);
  Validate::PrintErrorMessage(this_00);
  return;
}

Assistant:

inline void ValidateVulnerability::CheckVulnerabilityID() {
/* Check vulnerability ID does not exceed maximum integer value and
 * vulnerability IDs are in ascending order. */

  v_.vulnerability_id = CheckIDDoesNotExceedMaxLimit(vulIDName_,
						     initialVulID_);

  if (prevVulID_ <= v_.vulnerability_id) return;

  fprintf(stderr, "ERROR: Vulnerability IDs %d and %d in lines %d and %d"
		  " respectively are not in ascending order:\n%s\n%s\n",
	  prevVulID_, v_.vulnerability_id, lineno_ - 1, lineno_, line_,
	  prevLine_);
  PrintErrorMessage();

}